

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacPtr.c
# Opt level: O3

Vec_Ptr_t * Bac_PtrTransformBox(Vec_Ptr_t *vBox,Vec_Ptr_t *vGatesNames)

{
  int iVar1;
  char *__s;
  Vec_Ptr_t *vBox_00;
  void **ppvVar2;
  size_t sVar3;
  ulong uVar4;
  size_t __size;
  ulong uVar5;
  ulong uVar6;
  char *local_48;
  
  iVar1 = vBox->nSize;
  uVar5 = (ulong)iVar1;
  if (-1 < (long)uVar5) {
    vBox_00 = (Vec_Ptr_t *)malloc(0x10);
    vBox_00->nSize = 0;
    vBox_00->nCap = iVar1;
    if (iVar1 == 0) {
      vBox_00->pArray = (void **)0x0;
    }
    else {
      ppvVar2 = (void **)malloc(uVar5 << 3);
      vBox_00->pArray = ppvVar2;
      __size = 0;
      uVar6 = 0;
      uVar4 = 0;
      do {
        __s = (char *)vBox->pArray[uVar4];
        if (__s == (char *)0x0) {
          local_48 = (char *)0x0;
        }
        else {
          sVar3 = strlen(__s);
          local_48 = (char *)malloc(sVar3 + 1);
          strcpy(local_48,__s);
        }
        if ((int)uVar4 == (int)uVar5) {
          ppvVar2 = vBox_00->pArray;
          if (uVar4 < 0x10) {
            if (ppvVar2 == (void **)0x0) {
              ppvVar2 = (void **)malloc(0x80);
            }
            else {
              ppvVar2 = (void **)realloc(ppvVar2,0x80);
            }
            vBox_00->pArray = ppvVar2;
            uVar5 = 0x10;
          }
          else {
            if (ppvVar2 == (void **)0x0) {
              ppvVar2 = (void **)malloc(__size);
            }
            else {
              ppvVar2 = (void **)realloc(ppvVar2,__size);
            }
            vBox_00->pArray = ppvVar2;
            uVar5 = uVar6;
          }
        }
        else {
          ppvVar2 = vBox_00->pArray;
        }
        ppvVar2[uVar4] = local_48;
        uVar4 = uVar4 + 1;
        uVar6 = (ulong)((int)uVar6 + 2);
        __size = __size + 0x10;
      } while ((long)uVar4 < (long)vBox->nSize);
      vBox_00->nSize = (int)uVar4;
      vBox_00->nCap = (int)uVar5;
    }
    if (vGatesNames != (Vec_Ptr_t *)0x0) {
      Bac_PtrUpdateBox(vBox_00,vGatesNames);
    }
    return vBox_00;
  }
  __assert_fail("nCap >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                ,99,"Vec_Ptr_t *Vec_PtrAllocExact(int)");
}

Assistant:

Vec_Ptr_t * Bac_PtrTransformBox( Vec_Ptr_t * vBox, Vec_Ptr_t * vGatesNames )
{
    char * pName; int i;
    Vec_Ptr_t * vNew = Vec_PtrAllocExact( Vec_PtrSize(vBox) );
    Vec_PtrForEachEntry( char *, vBox, pName, i )
        Vec_PtrPush( vNew, Abc_UtilStrsav(pName) );
    if ( vGatesNames )
        Bac_PtrUpdateBox( vNew, vGatesNames );
    return vNew;
}